

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

color __thiscall
optimization::graph_color::Conflict_Map::available_color
          (Conflict_Map *this,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *neighbors)

{
  bool bVar1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  undefined8 in_RSI;
  long in_RDI;
  reference rVar2;
  reference rVar3;
  int i;
  VarId var;
  iterator __end2;
  iterator __begin2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range2;
  vector<bool,_std::allocator<bool>_> colors;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  VarId *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  bool *in_stack_ffffffffffffff20;
  _Bit_type in_stack_ffffffffffffff28;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff30;
  reference local_a0;
  uint local_8c;
  reference local_88 [2];
  _Self local_68;
  _Self local_60;
  undefined8 local_58;
  undefined1 local_39;
  undefined8 local_10;
  
  local_39 = 1;
  local_10 = in_RSI;
  std::allocator<bool>::allocator((allocator<bool> *)0x1b7259);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1b7287);
  local_58 = local_10;
  local_60._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_68._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  rVar2._M_mask = in_stack_ffffffffffffff28;
  rVar2._M_p = (_Bit_type *)in_stack_ffffffffffffff30;
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1b72ec);
    mir::inst::VarId::VarId
              (in_stack_ffffffffffffff10,
               (VarId *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::
    __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b7312);
    std::
    map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::at((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
          *)rVar2._M_p,(key_type *)rVar2._M_mask);
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar2._M_p,rVar2._M_mask);
    local_88[0] = rVar2;
    std::_Bit_reference::operator=(local_88,false);
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_ffffffffffffff10);
  }
  local_8c = 0;
  while( true ) {
    if (*(uint *)(in_RDI + 0x19c) <= local_8c) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                    ,0x117,
                    "color optimization::graph_color::Conflict_Map::available_color(std::set<mir::inst::VarId> &)"
                   );
    }
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar2._M_p,rVar2._M_mask);
    local_a0 = rVar3;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a0);
    if (bVar1) break;
    local_8c = local_8c + 1;
  }
  std::
  __shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b7435);
  this_00 = (set<int,_std::less<int>,_std::allocator<int>_> *)
            std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)rVar3._M_p,
                       (key_type *)rVar3._M_mask);
  if (this_00 != (set<int,_std::less<int>,_std::allocator<int>_> *)0x0) {
    std::
    __shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b7465);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (this_00,(key_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1b748b)
  ;
  return local_8c;
}

Assistant:

color available_color(std::set<mir::inst::VarId>& neighbors) {
    std::vector<bool> colors(color_num, true);
    for (auto var : neighbors) {
      colors[color_map->at(var)] = false;
    }
    for (int i = 0; i < color_num; i++) {
      if (colors[i]) {
        if (unused_colors->count(i)) {
          unused_colors->erase(i);
        }
        return i;
      }
    }
    // errors
    assert(false);
    return 0;
  }